

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O0

shared_ptr<Expr> __thiscall Parser::rel(Parser *this)

{
  int iVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Parser *in_RSI;
  shared_ptr<Expr> sVar4;
  undefined1 local_60 [48];
  undefined1 local_30 [8];
  shared_ptr<Token> tok;
  Parser *this_local;
  shared_ptr<Expr> *x;
  
  tok.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
  expr(this);
  peVar2 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &in_RSI->look);
  iVar1 = peVar2->tag;
  if ((((iVar1 == 0x3c) || (iVar1 == 0x3e)) || (iVar1 == 0x107)) ||
     (_Var3._M_pi = extraout_RDX, iVar1 == 0x10b)) {
    std::shared_ptr<Token>::shared_ptr((shared_ptr<Token> *)local_30,&in_RSI->look);
    move(in_RSI);
    expr((Parser *)local_60);
    std::make_shared<Rel,std::shared_ptr<Token>&,std::shared_ptr<Expr>&,std::shared_ptr<Expr>>
              ((shared_ptr<Token> *)(local_60 + 0x10),(shared_ptr<Expr> *)local_30,
               (shared_ptr<Expr> *)this);
    std::shared_ptr<Expr>::operator=((shared_ptr<Expr> *)this,(shared_ptr<Rel> *)(local_60 + 0x10));
    std::shared_ptr<Rel>::~shared_ptr((shared_ptr<Rel> *)(local_60 + 0x10));
    std::shared_ptr<Expr>::~shared_ptr((shared_ptr<Expr> *)local_60);
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_30);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar4.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Expr>)sVar4.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expr> rel() {
		std::shared_ptr<Expr> x = expr();
		switch (look->tag) {
		case '<':
		case LE:
		case GE:
		case '>':
			{
				std::shared_ptr<Token> tok = look; move();
				x = std::make_shared<Rel>(tok, x, expr());
			}
		default:
			return x;
			break;
		}
	}